

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash.cpp
# Opt level: O0

bool __thiscall
NJamSpell::TPerfectHash::Init
          (TPerfectHash *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  pointer this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  phf *phf;
  reference k;
  int res;
  phf *tempPhf;
  size_t local_70;
  reference local_68;
  string *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_38 [8];
  vector<phf_string,_std::allocator<phf_string>_> keysForPhf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys_local;
  TPerfectHash *this_local;
  
  keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)keys;
  std::vector<phf_string,_std::allocator<phf_string>_>::vector
            ((vector<phf_string,_std::allocator<phf_string>_> *)local_38);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::vector<phf_string,_std::allocator<phf_string>_>::reserve
            ((vector<phf_string,_std::allocator<phf_string>_> *)local_38,sVar3);
  this_00 = keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  s = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&s);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    tempPhf = (phf *)std::__cxx11::string::operator[]((ulong)local_68);
    local_70 = std::__cxx11::string::size();
    std::vector<phf_string,_std::allocator<phf_string>_>::push_back
              ((vector<phf_string,_std::allocator<phf_string>_> *)local_38,(value_type *)&tempPhf);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  phf = (phf *)operator_new(0x38);
  phf->d_max = 0;
  *(undefined8 *)&phf->g_op = 0;
  phf->m = 0;
  phf->g = (uint32_t *)0x0;
  phf->nodiv = false;
  *(undefined3 *)&phf->field_0x1 = 0;
  phf->seed = 0;
  phf->r = 0;
  phf->g_jmp = (void *)0x0;
  k = std::vector<phf_string,_std::allocator<phf_string>_>::operator[]
                ((vector<phf_string,_std::allocator<phf_string>_> *)local_38,0);
  sVar3 = std::vector<phf_string,_std::allocator<phf_string>_>::size
                    ((vector<phf_string,_std::allocator<phf_string>_> *)local_38);
  iVar2 = PHF::init<phf_string,false>(phf,k,sVar3,4,0x50,0x2a);
  if (iVar2 == 0) {
    Clear(this);
    this->Phf = phf;
    this_local._7_1_ = true;
  }
  else {
    PHF::destroy(phf);
    if (phf != (phf *)0x0) {
      operator_delete(phf);
    }
    this_local._7_1_ = false;
  }
  std::vector<phf_string,_std::allocator<phf_string>_>::~vector
            ((vector<phf_string,_std::allocator<phf_string>_> *)local_38);
  return this_local._7_1_;
}

Assistant:

bool TPerfectHash::Init(const std::vector<std::string>& keys) {
    std::vector<phf_string_t> keysForPhf;
    keysForPhf.reserve(keys.size());
    for (const std::string& s: keys) {
        keysForPhf.push_back({&s[0], s.size()});
    }

    phf* tempPhf = new phf();
    phf_error_t res = PHF::init<phf_string_t, false>(tempPhf, &keysForPhf[0], keysForPhf.size(), 4, 80, 42);
    if (res != 0) {
        PHF::destroy(tempPhf);
        delete tempPhf;
        return false;
    }
    Clear();
    Phf = tempPhf;
    return true;
}